

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * httplib::detail::make_multipart_data_boundary_abi_cxx11_(void)

{
  pointer *this;
  initializer_list<unsigned_int> __il;
  result_type_conflict rVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int local_2770;
  allocator<char> local_276a;
  undefined1 local_2769;
  int i;
  mt19937 engine;
  result_type local_13d0;
  result_type local_13cc;
  result_type local_13c8;
  result_type local_13c4;
  iterator local_13c0;
  undefined8 local_13b8;
  undefined1 local_13b0 [8];
  seed_seq seed_sequence;
  random_device seed_gen;
  string *result;
  
  this = &seed_sequence._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage;
  std::random_device::random_device((random_device *)this);
  local_13d0 = std::random_device::operator()((random_device *)this);
  local_13cc = std::random_device::operator()
                         ((random_device *)
                          &seed_sequence._M_v.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
  local_13c8 = std::random_device::operator()
                         ((random_device *)
                          &seed_sequence._M_v.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
  local_13c4 = std::random_device::operator()
                         ((random_device *)
                          &seed_sequence._M_v.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
  local_13c0 = &local_13d0;
  local_13b8 = 4;
  __il._M_len = 4;
  __il._M_array = local_13c0;
  std::seed_seq::seed_seq<unsigned_int,void>((seed_seq *)local_13b0,__il);
  std::
  mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>
  ::mersenne_twister_engine<std::seed_seq,void>
            ((mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>
              *)&i,(seed_seq *)local_13b0);
  local_2769 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,"--cpp-httplib-multipart-data-",&local_276a);
  std::allocator<char>::~allocator(&local_276a);
  for (local_2770 = 0; local_2770 < 0x10; local_2770 = local_2770 + 1) {
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)&i);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_RDI,"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[rVar1 % 0x3e]
              );
  }
  local_2769 = 1;
  std::seed_seq::~seed_seq((seed_seq *)local_13b0);
  std::random_device::~random_device
            ((random_device *)
             &seed_sequence._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return in_RDI;
}

Assistant:

inline std::string make_multipart_data_boundary() {
  static const char data[] =
      "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz";

  // std::random_device might actually be deterministic on some
  // platforms, but due to lack of support in the c++ standard library,
  // doing better requires either some ugly hacks or breaking portability.
  std::random_device seed_gen;

  // Request 128 bits of entropy for initialization
  std::seed_seq seed_sequence{seed_gen(), seed_gen(), seed_gen(), seed_gen()};
  std::mt19937 engine(seed_sequence);

  std::string result = "--cpp-httplib-multipart-data-";

  for (auto i = 0; i < 16; i++) {
    result += data[engine() % (sizeof(data) - 1)];
  }

  return result;
}